

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setRep(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  Representation RVar1;
  long in_RDI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  double in_stack_000000e0;
  cpp_dec_float<200U,_int,_void> *in_stack_000000e8;
  undefined8 local_28 [2];
  undefined8 *local_18;
  long local_10;
  undefined8 *local_8;
  
  reDim(unaff_retaddr);
  local_28[0] = 0;
  local_10 = in_RDI + 0x298;
  local_18 = local_28;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_000000e8,in_stack_000000e0);
  RVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_RDI + 8));
  if (RVar1 == ROW) {
    *(long *)(in_RDI + 0x350) = in_RDI + 800;
    *(long *)(in_RDI + 0x358) = in_RDI + 0x338;
  }
  else {
    *(long *)(in_RDI + 0x350) = in_RDI + 0x338;
    *(long *)(in_RDI + 0x358) = in_RDI + 800;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::setRep()
{
   assert(theLP != nullptr);

   reDim();
   minStab = 0.0;

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      thedesc.stat   = &thedesc.rowstat;
      thedesc.costat = &thedesc.colstat;
   }
   else
   {
      thedesc.stat   = &thedesc.colstat;
      thedesc.costat = &thedesc.rowstat;
   }
}